

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O3

int npf_utoa_rev(npf_uint_t val,char *buf,uint_fast8_t base,char case_adj)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  
  uVar3 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  lVar4 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = val;
    cVar5 = case_adj + '7';
    if (SUB168(auVar2 % auVar1,0) < 10) {
      cVar5 = '0';
    }
    buf[lVar4] = cVar5 + SUB161(auVar2 % auVar1,0);
    lVar4 = lVar4 + 1;
    bVar6 = uVar3 <= val;
    val = val / uVar3;
  } while (bVar6);
  return (uint)lVar4 & 0xff;
}

Assistant:

static NPF_NOINLINE int npf_utoa_rev(
    npf_uint_t val, char *buf, uint_fast8_t base, char case_adj) {
  uint_fast8_t n = 0;
  do {
    int_fast8_t const d = (int_fast8_t)(val % base);
    *buf++ = (char)(((d < 10) ? '0' : ('A' - 10 + case_adj)) + d);
    ++n;
    val /= base;
  } while (val);
  return (int)n;
}